

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  undefined8 uVar3;
  bool bVar4;
  allocator local_165;
  undefined4 local_164;
  allocator local_15d;
  undefined4 local_15c;
  FILE *fout [3];
  string local_138;
  string local_118;
  map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  parquetOutFiles;
  sigaction sa;
  
  fout[2] = (FILE *)0x0;
  parquetOutFiles._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &parquetOutFiles._M_t._M_impl.super__Rb_tree_header._M_header;
  parquetOutFiles._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  parquetOutFiles._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  parquetOutFiles._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  fout[0] = (FILE *)0x0;
  fout[1] = (FILE *)0x0;
  local_15c = 0;
  local_164 = 0;
  parquetOutFiles._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       parquetOutFiles._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  bVar1 = false;
  do {
    bVar4 = bVar1;
    iVar2 = getopt(argc,argv,"HvhM:m:Q:q:S:s:");
    bVar1 = true;
    switch(iVar2) {
    case 0x6d:
    case 0x71:
    case 0x73:
      break;
    case 0x6e:
    case 0x6f:
    case 0x70:
    case 0x72:
    case 0x74:
    case 0x75:
switchD_00106288_caseD_6e:
      help();
LAB_0010642c:
      exit(1);
    case 0x76:
      fprintf(_stderr,"%s : version: %s\n",*argv,"");
      goto LAB_0010642c;
    default:
      if (iVar2 == -1) {
        if (!bVar4) {
          memset(&sa,0,0x98);
          sigemptyset((sigset_t *)&sa.sa_mask);
          sa.__sigaction_handler.sa_handler = segfault_sigaction;
          sa.sa_flags = 4;
          sigaction(0xb,(sigaction *)&sa,(sigaction *)0x0);
          std::__cxx11::string::string((string *)&local_118,"",&local_165);
          std::__cxx11::string::string((string *)&local_138,"",&local_15d);
          initstreams(&local_118,&local_138);
          std::__cxx11::string::~string((string *)&local_138);
          std::__cxx11::string::~string((string *)&local_118);
          pltcalc::doit((bool)((byte)local_15c & 1),(bool)((byte)local_164 & 1),fout,
                        &parquetOutFiles);
          std::
          _Rb_tree<int,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::~_Rb_tree(&parquetOutFiles._M_t);
          return 0;
        }
        fwrite("FATAL: Apache arrow libraries for parquet output are missing.\nPlease install libraries and recompile to use this option.\n"
               ,0x79,1,_stderr);
        goto LAB_0010642c;
      }
      if (iVar2 == 0x48) {
        local_15c = 1;
        bVar1 = bVar4;
      }
      else {
        if (iVar2 == 0x4d) {
          std::__cxx11::string::string((string *)&sa,_optarg,&local_165);
          iVar2 = 0;
        }
        else if (iVar2 == 0x51) {
          std::__cxx11::string::string((string *)&sa,_optarg,&local_165);
          iVar2 = 2;
        }
        else {
          if (iVar2 != 0x53) goto switchD_00106288_caseD_6e;
          std::__cxx11::string::string((string *)&sa,_optarg,&local_165);
          iVar2 = 1;
        }
        openpipe(iVar2,(string *)&sa,fout);
        uVar3 = std::__cxx11::string::~string((string *)&sa);
        local_164 = (undefined4)CONCAT71((int7)((ulong)uVar3 >> 8),1);
        bVar1 = bVar4;
      }
    }
  } while( true );
}

Assistant:

int main(int argc, char *argv[])
{

	enum { MPLT = 0, SPLT, QPLT };

	int opt;
	bool skipHeader = false;
	bool ordOutput = false;
	FILE * fout[] = { nullptr, nullptr, nullptr };
	bool parquetOutput = false;
	std::map<int, std::string> parquetOutFiles;
	while ((opt = getopt(argc, argv, "HvhM:m:Q:q:S:s:")) != -1) {
		switch (opt) {
		case 'v':
#ifdef HAVE_PARQUET
			fprintf(stderr, "%s : version: %s : "
					"Parquet output enabled\n",
				argv[0], VERSION);
#else
			fprintf(stderr, "%s : version: %s\n", argv[0], VERSION);
#endif
			::exit(EXIT_FAILURE);
			break;
		case 'M':
			ordOutput = true;
			openpipe(MPLT, optarg, fout);
			break;
		case 'm':
			parquetOutput = true;
#ifdef HAVE_PARQUET
			parquetOutFiles[OasisParquet::MPLT] = optarg;
#endif
			break;
		case 'Q':
			ordOutput = true;
			openpipe(QPLT, optarg, fout);
			break;
		case 'q':
			parquetOutput = true;
#ifdef HAVE_PARQUET
			parquetOutFiles[OasisParquet::QPLT] = optarg;
#endif
			break;
		case 'S':
			ordOutput = true;
			openpipe(SPLT, optarg, fout);
			break;
		case 's':
			parquetOutput = true;
#ifdef HAVE_PARQUET
			parquetOutFiles[OasisParquet::SPLT] = optarg;
#endif
			break;
		case 'H':
			skipHeader = true;
			break;
		case 'h':
		default:
			help();
			::exit(EXIT_FAILURE);
		}
	}

#ifndef HAVE_PARQUET
	if (parquetOutput) {
		fprintf(stderr, "FATAL: Apache arrow libraries for parquet "
				"output are missing.\nPlease install libraries "
				"and recompile to use this option.\n");
		exit(EXIT_FAILURE);
	}
#endif

#if !defined(_MSC_VER) && !defined(__MINGW32__)
	struct sigaction sa;

	memset(&sa, 0, sizeof(struct sigaction));
	sigemptyset(&sa.sa_mask);
	sa.sa_sigaction = segfault_sigaction;
	sa.sa_flags = SA_SIGINFO;

	sigaction(SIGSEGV, &sa, NULL);
#endif

	try {
		initstreams();
		pltcalc::doit(skipHeader, ordOutput, fout, parquetOutFiles);
	}
	catch (std::bad_alloc&) {
		fprintf(stderr, "FATAL: %s: Memory allocation failed\n", progname);
		exit(EXIT_FAILURE);
	}
	return EXIT_SUCCESS;
}